

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cURLpp.cpp
# Opt level: O0

char * __thiscall curlpp::getenv(curlpp *this,char *__name)

{
  undefined8 uVar1;
  char *__ptr;
  RuntimeError *unaff_retaddr;
  char *p;
  string *buffer;
  curlpp *reason;
  
  reason = this;
  std::__cxx11::string::string((string *)this);
  uVar1 = std::__cxx11::string::c_str();
  __ptr = (char *)curl_getenv(uVar1);
  if (__ptr != (char *)0x0) {
    std::__cxx11::string::operator=((string *)this,__ptr);
    free(__ptr);
    return (char *)this;
  }
  uVar1 = __cxa_allocate_exception(0x10);
  RuntimeError::RuntimeError(unaff_retaddr,(char *)reason);
  __cxa_throw(uVar1,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

std::string
curlpp::getenv(const std::string & name)
{
   std::string buffer;
   char* p = curl_getenv(name.c_str());
   if (!p)
   {
      throw RuntimeError("unable to get the environnement string"); //we got an error
   }
   else
   {
      buffer = p;
      free(p);
   }
   return buffer;
}